

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::IRContext::ProcessReachableCallTree(IRContext *this,ProcessFunction *pfn)

{
  Instruction *pIVar1;
  bool bVar2;
  uint32_t uVar3;
  Function *pFVar4;
  Module *pMVar5;
  uint uVar6;
  Instruction *e;
  Instruction *pIVar7;
  uint32_t id;
  queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> roots;
  uint32_t local_94;
  ProcessFunction *local_90;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (uint32_t *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_90 = pfn;
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map(&local_88,0);
  pMVar5 = (this->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar1 = (Instruction *)
           ((long)&(pMVar5->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  pIVar7 = *(Instruction **)
            ((long)&(pMVar5->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  if (pIVar7 != pIVar1) {
    do {
      uVar6 = (pIVar7->has_result_id_ & 1) + 1;
      if (pIVar7->has_type_id_ == false) {
        uVar6 = (uint)pIVar7->has_result_id_;
      }
      local_94 = Instruction::GetSingleWordOperand(pIVar7,uVar6 + 1);
      std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,&local_94);
      pIVar7 = (pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar7 != pIVar1);
    pMVar5 = (this->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  }
  pIVar7 = *(Instruction **)
            ((long)&(pMVar5->annotations_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
            + 8);
  pIVar1 = &(pMVar5->annotations_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  if (pIVar7 != pIVar1) {
    do {
      if (((pIVar7->opcode_ == OpDecorate) &&
          (uVar3 = Instruction::GetSingleWordOperand(pIVar7,1), uVar3 == 0x29)) &&
         (uVar3 = Instruction::GetSingleWordOperand
                            (pIVar7,(int)((ulong)((long)(pIVar7->operands_).
                                                                                                                
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                 (long)(pIVar7->operands_).
                                                                                                              
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                                    -0x55555555 - 1), uVar3 == 0)) {
        local_94 = Instruction::GetSingleWordOperand(pIVar7,0);
        pFVar4 = GetFunction(this,local_94);
        if (pFVar4 != (Function *)0x0) {
          if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<unsigned_int,std::allocator<unsigned_int>>::
            _M_push_back_aux<unsigned_int_const&>
                      ((deque<unsigned_int,std::allocator<unsigned_int>> *)&local_88,&local_94);
          }
          else {
            *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_94;
            local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
        }
      }
      pIVar7 = (pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar7 != pIVar1);
  }
  bVar2 = ProcessCallTreeFromRoots
                    (this,local_90,
                     (queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)&local_88);
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(&local_88);
  return bVar2;
}

Assistant:

bool IRContext::ProcessReachableCallTree(ProcessFunction& pfn) {
  std::queue<uint32_t> roots;

  // Add all entry points since they can be reached from outside the module.
  for (auto& e : module()->entry_points())
    roots.push(e.GetSingleWordInOperand(kEntryPointFunctionIdInIdx));

  // Add all exported functions since they can be reached from outside the
  // module.
  for (auto& a : annotations()) {
    // TODO: Handle group decorations as well.  Currently not generate by any
    // front-end, but could be coming.
    if (a.opcode() == spv::Op::OpDecorate) {
      if (spv::Decoration(a.GetSingleWordOperand(1)) ==
          spv::Decoration::LinkageAttributes) {
        uint32_t lastOperand = a.NumOperands() - 1;
        if (spv::LinkageType(a.GetSingleWordOperand(lastOperand)) ==
            spv::LinkageType::Export) {
          uint32_t id = a.GetSingleWordOperand(0);
          if (GetFunction(id)) {
            roots.push(id);
          }
        }
      }
    }
  }

  return ProcessCallTreeFromRoots(pfn, &roots);
}